

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_sequential_decoder.cc
# Opt level: O2

bool __thiscall draco::MeshSequentialDecoder::DecodeConnectivity(MeshSequentialDecoder *this)

{
  ushort uVar1;
  ushort uVar2;
  DecoderBuffer *pDVar3;
  bool bVar4;
  int j;
  long lVar5;
  uint32_t i;
  uint uVar6;
  uint8_t val;
  uint32_t num_faces;
  uint8_t connectivity_method;
  Face face;
  uint32_t num_points;
  
  uVar1._0_1_ = (this->super_MeshDecoder).super_PointCloudDecoder.version_major_;
  uVar1._1_1_ = (this->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
  pDVar3 = (this->super_MeshDecoder).super_PointCloudDecoder.buffer_;
  if ((ushort)(uVar1 << 8 | uVar1 >> 8) < 0x202) {
    bVar4 = DecoderBuffer::Decode<unsigned_int>(pDVar3,&num_faces);
    if (!bVar4) {
      return false;
    }
    bVar4 = DecoderBuffer::Decode<unsigned_int>
                      ((this->super_MeshDecoder).super_PointCloudDecoder.buffer_,&num_points);
  }
  else {
    bVar4 = DecodeVarint<unsigned_int>(&num_faces,pDVar3);
    if (!bVar4) {
      return false;
    }
    bVar4 = DecodeVarint<unsigned_int>
                      (&num_points,(this->super_MeshDecoder).super_PointCloudDecoder.buffer_);
  }
  if ((((bVar4 != false) && ((ulong)num_faces < 0x55555556)) &&
      (pDVar3 = (this->super_MeshDecoder).super_PointCloudDecoder.buffer_,
      (ulong)num_faces <= (ulong)((pDVar3->data_size_ - pDVar3->pos_) / 3))) &&
     (bVar4 = DecoderBuffer::Decode<unsigned_char>(pDVar3,&connectivity_method), bVar4)) {
    if (connectivity_method == '\0') {
      bVar4 = DecodeAndDecompressIndices(this,num_faces);
      if (!bVar4) {
        return false;
      }
    }
    else if (num_points < 0x100) {
      for (uVar6 = 0; uVar6 < num_faces; uVar6 = uVar6 + 1) {
        face._M_elems[2].value_ = 0;
        face._M_elems[0].value_ = 0;
        face._M_elems[1].value_ = 0;
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          bVar4 = DecoderBuffer::Decode<unsigned_char>
                            ((this->super_MeshDecoder).super_PointCloudDecoder.buffer_,&val);
          if (!bVar4) {
            return false;
          }
          face._M_elems[lVar5].value_ = _val & 0xff;
        }
        std::
        vector<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
        ::push_back(&(((this->super_MeshDecoder).mesh_)->faces_).vector_,&face);
      }
    }
    else if (num_points < 0x10000) {
      for (uVar6 = 0; uVar6 < num_faces; uVar6 = uVar6 + 1) {
        face._M_elems[2].value_ = 0;
        face._M_elems[0].value_ = 0;
        face._M_elems[1].value_ = 0;
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          bVar4 = DecoderBuffer::Decode<unsigned_short>
                            ((this->super_MeshDecoder).super_PointCloudDecoder.buffer_,
                             (unsigned_short *)&val);
          if (!bVar4) {
            return false;
          }
          face._M_elems[lVar5].value_ = _val & 0xffff;
        }
        std::
        vector<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
        ::push_back(&(((this->super_MeshDecoder).mesh_)->faces_).vector_,&face);
      }
    }
    else if ((num_points < 0x200000) &&
            (uVar2._0_1_ = (this->super_MeshDecoder).super_PointCloudDecoder.version_major_,
            uVar2._1_1_ = (this->super_MeshDecoder).super_PointCloudDecoder.version_minor_,
            0x201 < (ushort)(uVar2 << 8 | uVar2 >> 8))) {
      for (uVar6 = 0; uVar6 < num_faces; uVar6 = uVar6 + 1) {
        face._M_elems[2].value_ = 0;
        face._M_elems[0].value_ = 0;
        face._M_elems[1].value_ = 0;
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          bVar4 = DecodeVarint<unsigned_int>
                            ((uint *)&val,(this->super_MeshDecoder).super_PointCloudDecoder.buffer_)
          ;
          if (!bVar4) {
            return false;
          }
          face._M_elems[lVar5].value_ = _val;
        }
        std::
        vector<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
        ::push_back(&(((this->super_MeshDecoder).mesh_)->faces_).vector_,&face);
      }
    }
    else {
      for (uVar6 = 0; uVar6 < num_faces; uVar6 = uVar6 + 1) {
        face._M_elems[2].value_ = 0;
        face._M_elems[0].value_ = 0;
        face._M_elems[1].value_ = 0;
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          bVar4 = DecoderBuffer::Decode<unsigned_int>
                            ((this->super_MeshDecoder).super_PointCloudDecoder.buffer_,(uint *)&val)
          ;
          if (!bVar4) {
            return false;
          }
          face._M_elems[lVar5].value_ = _val;
        }
        std::
        vector<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
        ::push_back(&(((this->super_MeshDecoder).mesh_)->faces_).vector_,&face);
      }
    }
    ((this->super_MeshDecoder).super_PointCloudDecoder.point_cloud_)->num_points_ = num_points;
    return true;
  }
  return false;
}

Assistant:

bool MeshSequentialDecoder::DecodeConnectivity() {
  uint32_t num_faces;
  uint32_t num_points;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (bitstream_version() < DRACO_BITSTREAM_VERSION(2, 2)) {
    if (!buffer()->Decode(&num_faces)) {
      return false;
    }
    if (!buffer()->Decode(&num_points)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint(&num_faces, buffer())) {
      return false;
    }
    if (!DecodeVarint(&num_points, buffer())) {
      return false;
    }
  }

  // Check that num_faces and num_points are valid values.
  const uint64_t faces_64 = static_cast<uint64_t>(num_faces);
  // Compressed sequential encoding can only handle (2^32 - 1) / 3 indices.
  if (faces_64 > 0xffffffff / 3) {
    return false;
  }
  if (faces_64 > buffer()->remaining_size() / 3) {
    // The number of faces is unreasonably high, because face indices do not
    // fit in the remaining size of the buffer.
    return false;
  }
  uint8_t connectivity_method;
  if (!buffer()->Decode(&connectivity_method)) {
    return false;
  }
  if (connectivity_method == 0) {
    if (!DecodeAndDecompressIndices(num_faces)) {
      return false;
    }
  } else {
    if (num_points < 256) {
      // Decode indices as uint8_t.
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint8_t val;
          if (!buffer()->Decode(&val)) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    } else if (num_points < (1 << 16)) {
      // Decode indices as uint16_t.
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint16_t val;
          if (!buffer()->Decode(&val)) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    } else if (num_points < (1 << 21) &&
               bitstream_version() >= DRACO_BITSTREAM_VERSION(2, 2)) {
      // Decode indices as uint32_t.
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint32_t val;
          if (!DecodeVarint(&val, buffer())) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    } else {
      // Decode faces as uint32_t (default).
      for (uint32_t i = 0; i < num_faces; ++i) {
        Mesh::Face face;
        for (int j = 0; j < 3; ++j) {
          uint32_t val;
          if (!buffer()->Decode(&val)) {
            return false;
          }
          face[j] = val;
        }
        mesh()->AddFace(face);
      }
    }
  }
  point_cloud()->set_num_points(num_points);
  return true;
}